

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineInterface.cpp
# Opt level: O2

void __thiscall
supermap::cli::CommandLineInterface::CommandLineInterface(CommandLineInterface *this,string *name)

{
  allocator<char> local_79;
  _Alloc_hider local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  string local_68;
  shared_ptr<supermap::cli::CommandLineInterface::Handler> local_48;
  shared_ptr<supermap::cli::CommandLineInterface::Handler> local_38;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  (this->handlers_)._M_h._M_buckets = &(this->handlers_)._M_h._M_single_bucket;
  (this->handlers_)._M_h._M_bucket_count = 1;
  (this->handlers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->handlers_)._M_h._M_element_count = 0;
  (this->handlers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->handlers_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->handlers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->running_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"help",&local_79);
  std::
  make_shared<supermap::cli::CommandLineInterface::HelpHandler,supermap::cli::CommandLineInterface&>
            ((CommandLineInterface *)&local_78);
  local_38.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_78._M_p;
  local_38.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_70._M_pi;
  local_78._M_p = (pointer)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addCommand(this,&local_68,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.
              super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"stop",&local_79);
  std::
  make_shared<supermap::cli::CommandLineInterface::StopHandler,supermap::cli::CommandLineInterface&>
            ((CommandLineInterface *)&local_78);
  local_48.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_78._M_p;
  local_48.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_70._M_pi;
  local_78._M_p = (pointer)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addCommand(this,&local_68,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.
              super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

CommandLineInterface::CommandLineInterface(std::string name)
    : name_(std::move(name)) {
    addCommand("help", std::make_shared<HelpHandler>(*this));
    addCommand("stop", std::make_shared<StopHandler>(*this));
}